

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void lambert_textured_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  double dVar1;
  array<vec<3UL,_int>,_3UL> pts;
  array<vec<2UL,_double>,_3UL> uvs;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int j;
  double *pdVar5;
  size_t i;
  ulong iface;
  size_t y;
  double *pdVar6;
  vec2f vVar7;
  vector<double,_std::allocator<double>_> zbuffer;
  vec3f n;
  TGAImage depth;
  array<vec<3UL,_int>,_3UL> screen_coords;
  array<vec<2UL,_double>,_3UL> uv_coords;
  vector<double,_std::allocator<double>_> local_188;
  double *local_170;
  vec3f local_168;
  TGAImage *local_150;
  undefined1 local_148 [24];
  vec<3UL,_double> vStack_130;
  vec<3UL,_double> local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  string local_d0;
  vec<3UL,_double> local_b0;
  vec<3UL,_double> local_98;
  vec3f local_80;
  double local_68 [7];
  
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_150 = image;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x2bf200);
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 360000;
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3) = 0xffefffffffffffff;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x2bf200);
  iface = 0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_170 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  while( true ) {
    sVar2 = Model::nfaces(model);
    if (sVar2 <= iface) break;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_d8 = 0;
    local_118.x = 0.0;
    local_118.y = 0.0;
    vStack_130.y = 0.0;
    vStack_130.z = 0.0;
    local_148._16_8_ = (pointer)0x0;
    vStack_130.x = 0.0;
    local_148._0_8_ = (pointer)0x0;
    local_148._8_8_ = (pointer)0x0;
    local_118.z = 0.0;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    local_68[4] = 0.0;
    local_68[5] = 0.0;
    pdVar6 = local_68 + 1;
    lVar3 = 0;
    sVar2 = 0;
    do {
      Model::vert(&local_80,model,iface,sVar2);
      iVar4 = (int)local_80.z;
      *(ulong *)((long)&local_f8 + lVar3) =
           CONCAT44((int)((local_80.y + 1.0) * 600.0 * 0.5 + 0.5),
                    (int)((local_80.x + 1.0) * 600.0 * 0.5 + 0.5));
      *(int *)((long)&uStack_f0 + lVar3) = iVar4;
      Model::vert(&local_168,model,iface,sVar2);
      *(double *)(local_148 + lVar3 * 2 + 0x10) = local_168.z;
      *(double *)(local_148 + lVar3 * 2) = local_168.x;
      *(double *)(local_148 + lVar3 * 2 + 8) = local_168.y;
      vVar7 = Model::uv(model,iface,sVar2);
      pdVar6[-1] = vVar7.x;
      *pdVar6 = vVar7.y;
      sVar2 = sVar2 + 1;
      lVar3 = lVar3 + 0xc;
      pdVar6 = pdVar6 + 2;
    } while (sVar2 != 3);
    operator-(&local_98,&local_118,(vec<3UL,_double> *)local_148);
    operator-(&local_b0,&vStack_130,(vec<3UL,_double> *)local_148);
    local_168.x = local_98.y * local_b0.z - local_b0.y * local_98.z;
    local_168.y = local_98.z * local_b0.x - local_b0.z * local_98.x;
    local_168.z = local_98.x * local_b0.y - local_b0.x * local_98.y;
    vec<3UL,_double>::normalize(&local_168);
    dVar1 = dot<3ul,double>(&local_168,&light_dir);
    if (0.0 < dVar1) {
      pts._M_elems[0].z = (undefined4)uStack_f0;
      pts._M_elems[1].x = uStack_f0._4_4_;
      pts._M_elems[0].x = (undefined4)local_f8;
      pts._M_elems[0].y = local_f8._4_4_;
      pts._M_elems[1].y = (undefined4)local_e8;
      pts._M_elems[1].z = local_e8._4_4_;
      pts._M_elems[2].x = (undefined4)uStack_e0;
      pts._M_elems[2].y = uStack_e0._4_4_;
      pts._M_elems[2].z = local_d8;
      uvs._M_elems[0].y = local_68[1];
      uvs._M_elems[0].x = local_68[0];
      uvs._M_elems[1].x = local_68[2];
      uvs._M_elems[1].y = local_68[3];
      uvs._M_elems[2].x = local_68[4];
      uvs._M_elems[2].y = local_68[5];
      triangle_textured(pts,uvs,&local_188,local_150,model);
    }
    iface = iface + 1;
  }
  TGAImage::TGAImage((TGAImage *)local_148,600,600,1);
  sVar2 = 0;
  pdVar6 = local_170;
  do {
    y = 0;
    pdVar5 = pdVar6;
    do {
      local_168.x._0_5_ = CONCAT41(0x1000000,(char)(int)((*pdVar5 + 1.0) * 128.0));
      TGAImage::set((TGAImage *)local_148,sVar2,y,(TGAColor *)&local_168);
      y = y + 1;
      pdVar5 = pdVar5 + 600;
    } while (y != 600);
    sVar2 = sVar2 + 1;
    pdVar6 = pdVar6 + 1;
  } while (sVar2 != 600);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"depth.tga","");
  TGAImage::write_tga_file((TGAImage *)local_148,&local_d0,true,true);
  pdVar6 = local_170;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
  }
  operator_delete(pdVar6,0x2bf200);
  return;
}

Assistant:

void lambert_textured_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        std::array<vec2f, 3> uv_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
            uv_coords[j] = model.uv(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);

        if (intensity > 0) {
            triangle_textured(screen_coords, uv_coords, zbuffer, image, model);
        }
    }
    TGAImage depth(width, height, TGAImage::GRAYSCALE);
    for (size_t h = 0; h < height; h++)
        for (size_t w = 0; w < width; w++)
            depth.set(h, w, static_cast<uint8_t>((zbuffer[w * height + h] + 1) * 128));

    depth.write_tga_file("depth.tga");
}